

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseScriptModule
          (WastParser *this,
          unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> *out_module)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  pointer pDVar4;
  pointer pDVar5;
  pointer pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a2;
  allocator local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  iterator local_180;
  size_type local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  Enum local_154;
  _Type local_150;
  unique_ptr<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>_> local_148;
  unique_ptr<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>_> tsm;
  unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
  qsm;
  undefined1 local_130 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
  local_d8;
  unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
  bsm;
  undefined1 local_c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 local_70 [8];
  string name;
  undefined1 local_48 [8];
  Location loc;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> *out_module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  name.field_2._12_4_ = Expect(this,Module);
  bVar1 = Failed((Result)name.field_2._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  std::__cxx11::string::string((string *)local_70);
  ParseBindVarOpt(this,(string *)local_70);
  TVar2 = Peek(this,0);
  if (TVar2 == Bin) {
    Consume((Token *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
    bsm._M_t.
    super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
    .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>._M_head_impl.
    _4_4_ = ParseTextList(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
    bVar1 = Failed(bsm._M_t.
                   super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
                   .
                   super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>
                   ._M_head_impl._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      bsm._M_t.
      super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>.
      _M_head_impl._0_4_ = 1;
    }
    else {
      MakeUnique<wabt::DataScriptModule<(wabt::ScriptModuleType)1>>();
      pDVar4 = std::
               unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
               ::operator->(&local_d8);
      std::__cxx11::string::operator=((string *)&pDVar4->name,(string *)local_70);
      pDVar4 = std::
               unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
               ::operator->(&local_d8);
      (pDVar4->loc).filename.data_ = (char *)local_48;
      (pDVar4->loc).filename.size_ = (size_type)loc.filename.data_;
      (pDVar4->loc).field_1.field_1.offset = loc.filename.size_;
      ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
      ((long)&(pDVar4->loc).field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
      pDVar4 = std::
               unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
               ::operator->(&local_d8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&pDVar4->data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
      std::unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>>::operator=
                ((unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>> *)
                 out_module,&local_d8);
      bsm._M_t.
      super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>.
      _M_head_impl._0_4_ = 6;
      std::
      unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      ::~unique_ptr(&local_d8);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
    goto joined_r0x0031ed5a;
  }
  if (TVar2 == Quote) {
    Consume((Token *)&data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    RVar3 = ParseTextList(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    bVar1 = Failed(RVar3);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      bsm._M_t.
      super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>.
      _M_head_impl._0_4_ = 1;
    }
    else {
      MakeUnique<wabt::DataScriptModule<(wabt::ScriptModuleType)2>>();
      pDVar5 = std::
               unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
               ::operator->((unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
                             *)&tsm);
      std::__cxx11::string::operator=((string *)&pDVar5->name,(string *)local_70);
      pDVar5 = std::
               unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
               ::operator->((unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
                             *)&tsm);
      (pDVar5->loc).filename.data_ = (char *)local_48;
      (pDVar5->loc).filename.size_ = (size_type)loc.filename.data_;
      (pDVar5->loc).field_1.field_1.offset = loc.filename.size_;
      ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
      ((long)&(pDVar5->loc).field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
      pDVar5 = std::
               unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
               ::operator->((unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
                             *)&tsm);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&pDVar5->data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
      std::unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>>::operator=
                ((unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>> *)
                 out_module,
                 (unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
                  *)&tsm);
      bsm._M_t.
      super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>.
      _M_head_impl._0_4_ = 6;
      std::
      unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
      ::~unique_ptr((unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
                     *)&tsm);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    goto joined_r0x0031ed5a;
  }
  MakeUnique<wabt::TextScriptModule>();
  pTVar6 = std::unique_ptr<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>_>::
           operator->(&local_148);
  std::__cxx11::string::operator=((string *)&(pTVar6->module).name,(string *)local_70);
  pTVar6 = std::unique_ptr<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>_>::
           operator->(&local_148);
  (pTVar6->module).loc.filename.data_ = (char *)local_48;
  (pTVar6->module).loc.filename.size_ = (size_type)loc.filename.data_;
  (pTVar6->module).loc.field_1.field_1.offset = loc.filename.size_;
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
  ((long)&(pTVar6->module).loc.field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
  local_150 = (_Type)PeekPair(this);
  bVar1 = anon_unknown_1::IsModuleField((TokenTypePair)local_150);
  if (bVar1) {
    pTVar6 = std::unique_ptr<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>_>::
             operator->(&local_148);
    local_154 = (Enum)ParseModuleFieldList(this,&pTVar6->module);
    bVar1 = Failed((Result)local_154);
    if (!bVar1) goto LAB_0031f08a;
    Result::Result((Result *)((long)&this_local + 4),Error);
    bsm._M_t.
    super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
    .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>._M_head_impl.
    _0_4_ = 1;
  }
  else {
    bVar1 = PeekMatch(this,Rpar);
    if (bVar1) {
LAB_0031f08a:
      std::unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>>::operator=
                ((unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>> *)
                 out_module,&local_148);
      bsm._M_t.
      super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>.
      _M_head_impl._0_4_ = 6;
    }
    else {
      ConsumeIfLpar(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a0,"a module field",&local_1a1);
      local_180 = &local_1a0;
      local_178 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_1a2);
      __l._M_len = local_178;
      __l._M_array = local_180;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_170,__l,&local_1a2);
      this_local._4_4_ = ErrorExpected(this,&local_170,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_170);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_1a2);
      local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180;
      do {
        local_1c8 = local_1c8 + -1;
        std::__cxx11::string::~string((string *)local_1c8);
      } while (local_1c8 != &local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      bsm._M_t.
      super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>.
      _M_head_impl._0_4_ = 1;
    }
  }
  std::unique_ptr<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>_>::~unique_ptr
            (&local_148);
joined_r0x0031ed5a:
  if ((int)bsm._M_t.
           super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
           .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>.
           _M_head_impl == 6) {
    RVar3 = Expect(this,Rpar);
    bVar1 = Failed(RVar3);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      bsm._M_t.
      super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>.
      _M_head_impl._0_4_ = 1;
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      bsm._M_t.
      super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)1>_>_>
      .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)1>_*,_false>.
      _M_head_impl._0_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_70);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseScriptModule(
    std::unique_ptr<ScriptModule>* out_module) {
  WABT_TRACE(ParseScriptModule);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Module);
  std::string name;
  ParseBindVarOpt(&name);

  switch (Peek()) {
    case TokenType::Bin: {
      Consume();
      std::vector<uint8_t> data;
      // TODO(binji): The spec allows this to be empty, switch to
      // ParseTextListOpt.
      CHECK_RESULT(ParseTextList(&data));

      auto bsm = MakeUnique<BinaryScriptModule>();
      bsm->name = name;
      bsm->loc = loc;
      bsm->data = std::move(data);
      *out_module = std::move(bsm);
      break;
    }

    case TokenType::Quote: {
      Consume();
      std::vector<uint8_t> data;
      // TODO(binji): The spec allows this to be empty, switch to
      // ParseTextListOpt.
      CHECK_RESULT(ParseTextList(&data));

      auto qsm = MakeUnique<QuotedScriptModule>();
      qsm->name = name;
      qsm->loc = loc;
      qsm->data = std::move(data);
      *out_module = std::move(qsm);
      break;
    }

    default: {
      auto tsm = MakeUnique<TextScriptModule>();
      tsm->module.name = name;
      tsm->module.loc = loc;
      if (IsModuleField(PeekPair())) {
        CHECK_RESULT(ParseModuleFieldList(&tsm->module));
      } else if (!PeekMatch(TokenType::Rpar)) {
        ConsumeIfLpar();
        return ErrorExpected({"a module field"});
      }
      *out_module = std::move(tsm);
      break;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}